

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_006214e0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = arena;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->field_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->field_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->field_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->field_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->nested_type_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->extension_range_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_DescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base.visit_status.
      super___atomic_base<int>._M_i != 0) {
    internal::InitSCCImpl(&scc_info_DescriptorProto_google_2fprotobuf_2fdescriptor_2eproto.base);
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->options_ = (MessageOptions *)0x0;
  return;
}

Assistant:

DescriptorProto::DescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena),
  field_(arena),
  nested_type_(arena),
  enum_type_(arena),
  extension_range_(arena),
  extension_(arena),
  oneof_decl_(arena),
  reserved_range_(arena),
  reserved_name_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.DescriptorProto)
}